

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_irem(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  ostream *poVar1;
  Value VVar2;
  Value VVar3;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  if (VVar2.type != INT) {
    __assert_fail("value_2.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x8bf,"void ExecutionEngine::i_irem()");
  }
  if ((VVar3._0_8_ & 0xffffffff00000000) == 0x400000000) {
    if (VVar2.data._0_4_ != 0) {
      VVar2.data.longValue =
           (long)((ulong)(uint)(VVar3.data._0_4_ >> 0x1f) << 0x20 |
                 VVar3.data.longValue & 0xffffffffU) % (long)VVar2.data._0_4_ & 0xffffffffU |
           VVar3.data.longValue & 0xffffffff00000000U;
      VVar2.printType = INT;
      VVar2.type = INT;
      Frame::pushIntoOperandStack(this_01,VVar2);
      this_01->pc = this_01->pc + 1;
      return;
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"ArithmeticException");
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(2);
  }
  __assert_fail("value_1.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x8c0,"void ExecutionEngine::i_irem()");
}

Assistant:

void ExecutionEngine::i_irem() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value_2 = topFrame->popTopOfOperandStack();
    Value value_1 = topFrame->popTopOfOperandStack();

    assert(value_2.type == ValueType::INT);
    assert(value_1.type == ValueType::INT);
	if (value_2.data.intValue == 0) {
		cerr << "ArithmeticException" << endl;
        exit(2);
	}
	
    value_1.printType = ValueType::INT;
	value_1.data.intValue = value_1.data.intValue - (value_1.data.intValue / value_2.data.intValue)*value_2.data.intValue;
    topFrame->pushIntoOperandStack(value_1);

    topFrame->pc += 1;
}